

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_39a3::TestSetValueWithNUL(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  bool bVar5;
  __type _Var6;
  allocator local_3b1;
  string local_3b0 [8];
  string expected;
  string local_390 [8];
  string dump;
  allocator local_369;
  string local_368 [32];
  TemplateString local_348;
  allocator local_321;
  string local_320 [32];
  TemplateString local_300;
  allocator local_2d9;
  string local_2d8 [32];
  TemplateString local_2b8;
  allocator local_291;
  string local_290 [32];
  TemplateString local_270;
  TemplateString local_250;
  TemplateString local_230;
  TemplateString local_210;
  TemplateString local_1f0;
  allocator local_1c9;
  string local_1c8 [32];
  TemplateString local_1a8;
  allocator local_181;
  string local_180 [32];
  TemplateString local_160;
  allocator local_139;
  string local_138 [32];
  TemplateString local_118;
  allocator local_f1;
  string local_f0 [32];
  TemplateString local_d0;
  TemplateDictionaryPeer local_a0;
  TemplateDictionaryPeer peer;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"test_SetValueWithNUL");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_78,(TemplateString *)&peer,(UnsafeArena *)0x0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_a0,local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"FOO",7,&local_f1);
  ctemplate::TemplateString::TemplateString(&local_d0,(string *)local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"QUX",8,&local_139);
  ctemplate::TemplateString::TemplateString(&local_118,(string *)local_138);
  TVar1.length_ = local_d0.length_;
  TVar1.ptr_ = local_d0.ptr_;
  TVar1.is_immutable_ = local_d0.is_immutable_;
  TVar1._17_7_ = local_d0._17_7_;
  TVar1.id_ = local_d0.id_;
  TVar3.length_ = local_118.length_;
  TVar3.ptr_ = local_118.ptr_;
  TVar3.is_immutable_ = local_118.is_immutable_;
  TVar3._17_7_ = local_118._17_7_;
  TVar3.id_ = local_118.id_;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar3);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"GOO",7,&local_181);
  ctemplate::TemplateString::TemplateString(&local_160,(string *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"GUX",8,&local_1c9);
  ctemplate::TemplateString::TemplateString(&local_1a8,(string *)local_1c8);
  TVar2.length_ = local_160.length_;
  TVar2.ptr_ = local_160.ptr_;
  TVar2.is_immutable_ = local_160.is_immutable_;
  TVar2._17_7_ = local_160._17_7_;
  TVar2.id_ = local_160.id_;
  TVar4.length_ = local_1a8.length_;
  TVar4.ptr_ = local_1a8.ptr_;
  TVar4.is_immutable_ = local_1a8.is_immutable_;
  TVar4._17_7_ = local_1a8._17_7_;
  TVar4.id_ = local_1a8.id_;
  ctemplate::TemplateDictionary::SetGlobalValue(TVar2,TVar4);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  ctemplate::TemplateString::TemplateString(&local_1f0,"FOO");
  ctemplate::TemplateString::TemplateString(&local_210,"");
  bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_1f0,&local_210);
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"FOO\", \"\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_230,"GOO");
  ctemplate::TemplateString::TemplateString(&local_250,"");
  bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_230,&local_250);
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"GOO\", \"\")");
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"FOO",7,&local_291);
  ctemplate::TemplateString::TemplateString(&local_270,(string *)local_290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"QUX",8,&local_2d9);
  ctemplate::TemplateString::TemplateString(&local_2b8,(string *)local_2d8);
  bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_270,&local_2b8);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "peer.ValueIs(string(\"FOO\\0BAR\", 7), string(\"QUX\\0QUUX\", 8))");
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"GOO",7,&local_321);
  ctemplate::TemplateString::TemplateString(&local_300,(string *)local_320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"GUX",8,&local_369);
  ctemplate::TemplateString::TemplateString(&local_348,(string *)local_368);
  bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_300,&local_348);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  if (((bVar5 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string(local_390);
    ctemplate::TemplateDictionary::DumpToString((string *)local_78,(int)local_390);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_3b0,
               "global dictionary {\n   BI_NEWLINE: >\n<\n   BI_SPACE: > <\n   GLOBAL: >top<\n   GOO"
               ,0xa0,&local_3b1);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_390,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_3b0);
    if (!_Var6) {
      fprintf(_stderr,"Check failed: %s %s %s\n","dump","==","expected");
      exit(1);
    }
    std::__cxx11::string::~string(local_3b0);
    std::__cxx11::string::~string(local_390);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
    return;
  }
  fprintf(_stderr,"Check failed: %s\n",
          "peer.ValueIs(string(\"GOO\\0GAR\", 7), string(\"GUX\\0GUUX\", 8))");
  exit(1);
}

Assistant:

void TestSetValueWithNUL() {
  TemplateDictionary dict("test_SetValueWithNUL", NULL);
  TemplateDictionaryPeer peer(&dict);

  // Test copying char*s, strings, and explicit TemplateStrings
  dict.SetValue(string("FOO\0BAR", 7), string("QUX\0QUUX", 8));
  dict.SetGlobalValue(string("GOO\0GAR", 7), string("GUX\0GUUX", 8));

  // FOO should not match FOO\0BAR
  EXPECT_TRUE(peer.ValueIs("FOO", ""));
  EXPECT_TRUE(peer.ValueIs("GOO", ""));

  EXPECT_TRUE(peer.ValueIs(string("FOO\0BAR", 7), string("QUX\0QUUX", 8)));
  EXPECT_TRUE(peer.ValueIs(string("GOO\0GAR", 7), string("GUX\0GUUX", 8)));

  string dump;
  dict.DumpToString(&dump);
  // We can't use EXPECT_STREQ here because of the embedded NULs.
  // They also require I count the length of the string by hand. :-(
  string expected(("global dictionary {\n"
                   "   BI_NEWLINE: >\n"
                   "<\n"
                   "   BI_SPACE: > <\n"
                   "   GLOBAL: >top<\n"
                   "   GOO\0GAR: >GUX\0GUUX<\n"
                   "};\n"
                   "dictionary 'test_SetValueWithNUL' {\n"
                   "   FOO\0BAR: >QUX\0QUUX<\n"
                   "}\n"),
                  160);
  EXPECT_EQ(dump, expected);
}